

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

int xc_func_init(xc_func_type *func,int functional,int nspin)

{
  xc_dimensions *dim;
  byte *pbVar1;
  double dVar2;
  _func_void_xc_func_type_ptr *p_Var3;
  int iVar4;
  undefined8 in_RAX;
  xc_func_info_type *pxVar5;
  double *pdVar6;
  xc_func_info_type **ppxVar7;
  long lVar8;
  long lVar9;
  int number;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  func->info = (xc_func_info_type *)0x0;
  *(undefined8 *)&func->n_func_aux = 0;
  *(undefined8 *)((long)&func->func_aux + 4) = 0;
  *(undefined8 *)((long)&func->mix_coef + 4) = 0;
  *(undefined8 *)((long)&func->cam_omega + 4) = 0;
  *(undefined8 *)((long)&func->cam_alpha + 4) = 0;
  *(undefined8 *)((long)&func->cam_beta + 4) = 0;
  func->nlc_b = 0.0;
  func->nlc_C = 0.0;
  func->ext_params = (double *)0x0;
  func->params = (void *)0x0;
  func->dens_threshold = 0.0;
  func->zeta_threshold = 0.0;
  func->sigma_threshold = 0.0;
  func->tau_threshold = 0.0;
  func->nspin = nspin;
  pxVar5 = (xc_func_info_type *)malloc(0xa0);
  dim = &func->dim;
  memset(dim,0,0x128);
  iVar4 = xc_family_from_id(functional,(int *)0x0,&local_34);
  if (iVar4 < 0x20) {
    if (iVar4 == 1) {
      ppxVar7 = xc_lda_known_funct;
LAB_0015861c:
      memcpy(pxVar5,ppxVar7[local_34],0xa0);
      internal_counters_set_lda(nspin,dim);
      goto LAB_0015869a;
    }
    if (iVar4 != 2) {
      if (iVar4 != 4) {
        return -2;
      }
      ppxVar7 = xc_mgga_known_funct;
LAB_0015867e:
      memcpy(pxVar5,ppxVar7[local_34],0xa0);
      internal_counters_set_mgga(nspin,dim);
      goto LAB_0015869a;
    }
    ppxVar7 = xc_gga_known_funct;
  }
  else {
    if (iVar4 != 0x20) {
      if (iVar4 == 0x40) {
        ppxVar7 = xc_hyb_mgga_known_funct;
        goto LAB_0015867e;
      }
      if (iVar4 != 0x80) {
        return -2;
      }
      ppxVar7 = xc_hyb_lda_known_funct;
      goto LAB_0015861c;
    }
    ppxVar7 = xc_hyb_gga_known_funct;
  }
  memcpy(pxVar5,ppxVar7[local_34],0xa0);
  internal_counters_set_gga(nspin,dim);
LAB_0015869a:
  func->info = pxVar5;
  pbVar1 = (byte *)((long)&pxVar5->flags + 2);
  *pbVar1 = *pbVar1 | 2;
  dVar2 = pxVar5->dens_threshold;
  func->dens_threshold = dVar2;
  dVar2 = pow(dVar2,1.3333333333333333);
  func->sigma_threshold = dVar2;
  func->zeta_threshold = 2.220446049250313e-16;
  func->tau_threshold = 1e-20;
  p_Var3 = func->info->init;
  if (p_Var3 != (_func_void_xc_func_type_ptr *)0x0) {
    (*p_Var3)(func);
  }
  pxVar5 = func->info;
  lVar8 = (long)(pxVar5->ext_params).n;
  if (0 < lVar8) {
    pdVar6 = (double *)malloc(lVar8 << 3);
    func->ext_params = pdVar6;
    xc_func_set_ext_params(func,(pxVar5->ext_params).values);
    pxVar5 = func->info;
    lVar8 = (long)(pxVar5->ext_params).n;
    if (0 < lVar8) {
      lVar9 = 0;
      do {
        if (((pxVar5->ext_params).names[lVar9] == (char *)0x0) ||
           ((pxVar5->ext_params).descriptions[lVar9] == (char *)0x0)) {
          xc_func_init_cold_1();
          return -1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  }
  return 0;
}

Assistant:

int xc_func_init(xc_func_type *func, int functional, int nspin)
{
  int number;

  assert(func != NULL);
  assert(nspin==XC_UNPOLARIZED || nspin==XC_POLARIZED);

  xc_func_nullify(func);

  /* initialize structure */
  func->nspin       = nspin;

  // we have to make a copy because the *_known_funct arrays live in
  // host memory (libxc_malloc instead returns memory than can be read
  // from GPU and CPU).
  xc_func_info_type * finfo = (xc_func_info_type *) libxc_malloc(sizeof(xc_func_info_type));

  // initialize the dimension structure
  libxc_memset(&(func->dim), 0, sizeof(xc_dimensions));
  switch(xc_family_from_id(functional, NULL, &number)){
  case(XC_FAMILY_LDA):
    *finfo = *xc_lda_known_funct[number];
    internal_counters_set_lda(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_LDA):
    *finfo = *xc_hyb_lda_known_funct[number];
    internal_counters_set_lda(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_GGA):
    *finfo = *xc_gga_known_funct[number];
    internal_counters_set_gga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_GGA):
    *finfo = *xc_hyb_gga_known_funct[number];
    internal_counters_set_gga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_MGGA):
    *finfo = *xc_mgga_known_funct[number];
    internal_counters_set_mgga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_MGGA):
    *finfo = *xc_hyb_mgga_known_funct[number];
    internal_counters_set_mgga(func->nspin, &(func->dim));
    break;

  default:
    return -2; /* family not found */
  }
  func->info = finfo;

#ifdef XC_ENFORCE_FERMI_HOLE_CURVATURE
  /* Set the flag to enforce Fermi curvature by default */
  func->info->flags = func->info->flags | XC_FLAGS_ENFORCE_FHC;
#endif

  /* this is initialized for each functional from the info */
  func->dens_threshold = func->info->dens_threshold;
  /* the density and sigma cutoffs should be connected, especially in
     the case of kinetic energy functionals. This is the correct
     scaling */
  func->sigma_threshold = pow(func->info->dens_threshold, 4.0/3.0);

  /* these are reasonable defaults */
  func->zeta_threshold  = DBL_EPSILON;
  func->tau_threshold   = 1e-20;

  /* see if we need to initialize the functional */
  if(func->info->init != NULL)
    func->info->init(func);

  /* see if we need to initialize the external parameters */
  if(func->info->ext_params.n > 0) {
    func->ext_params = (double *) libxc_malloc(func->info->ext_params.n * sizeof(double));
    xc_func_set_ext_params(func, func->info->ext_params.values);

    /* sanity check external parameter names and descriptions */
    for(int i=0; i<func->info->ext_params.n; i++) {
      if(func->info->ext_params.names[i] == NULL) {
        char * name = xc_functional_get_name(functional);
        fprintf(stderr,"Internal error in %s: external parameter %i name is NULL\n",name,i);
        free(name);
        xc_func_end(func);
        return -1;
      }
      if(func->info->ext_params.descriptions[i] == NULL) {
        char * name = xc_functional_get_name(functional);
        fprintf(stderr,"Internal error in %s: external parameter %i description is NULL\n",name,i);
        free(name);
        xc_func_end(func);
        return -1;
      }
    }
  }

  return 0;
}